

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex_base.h
# Opt level: O0

void __thiscall
Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::read_perseus_style_file
          (Bitmap_cubical_complex_base<double> *this,char *perseus_style_file)

{
  size_t sVar1;
  byte bVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  error_code *peVar6;
  size_t cell;
  double *pdVar7;
  string *psVar8;
  string local_410;
  string local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  undefined1 local_370 [8];
  string perseus_error_1;
  error_code local_330;
  undefined1 local_320 [8];
  string perseus_error;
  undefined1 local_2f8 [4];
  int n;
  string line;
  size_t filtration_counter;
  double filtrationLevel;
  Top_dimensional_cells_iterator it;
  ulong uStack_2a0;
  uint size_in_this_dimension;
  size_t i;
  size_t dimensions;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sizes;
  uint dimensionOfData;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long local_220;
  ifstream inFiltration;
  char *perseus_style_file_local;
  Bitmap_cubical_complex_base<double> *this_local;
  
  std::ifstream::ifstream(&local_220,perseus_style_file,8);
  bVar2 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar2 & 1) != 0) {
    sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    psVar8 = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dimensionOfData,"Could not open the file ",
               (allocator<char> *)
               ((long)&sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    std::operator+(&local_250,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &dimensionOfData,perseus_style_file);
    std::ios_base::failure[abi:cxx11]::failure(psVar8);
    sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(psVar8,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
  std::istream::operator>>
            ((istream *)&local_220,
             (uint *)&sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dimensions);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dimensions,
             (ulong)(uint)sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  i = 1;
  for (uStack_2a0 = 0;
      uStack_2a0 !=
      (uint)sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage; uStack_2a0 = uStack_2a0 + 1) {
    std::istream::operator>>((istream *)&local_220,(uint *)((long)&it.b + 4));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dimensions,
               (value_type *)((long)&it.b + 4));
    i = it.b._4_4_ * i;
  }
  set_up_containers(this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dimensions,true);
  top_dimensional_cells_iterator_begin((Top_dimensional_cells_iterator *)&filtrationLevel,this);
  filtration_counter = 0;
  line.field_2._8_8_ = 0;
  while( true ) {
    bVar2 = std::ios::eof();
    if (((bVar2 ^ 0xff) & 1) == 0) break;
    std::__cxx11::string::string((string *)local_2f8);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&local_220,(string *)local_2f8);
    lVar3 = std::__cxx11::string::length();
    if (lVar3 != 0) {
      uVar4 = std::__cxx11::string::c_str();
      perseus_error.field_2._12_4_ = __isoc99_sscanf(uVar4,"%lf",&filtration_counter);
      sVar1 = filtration_counter;
      if (perseus_error.field_2._12_4_ != 1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_320,"Bad Perseus file format. This line is incorrect : ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2f8);
        pcVar5 = (char *)__cxa_allocate_exception(0x20);
        peVar6 = (error_code *)std::__cxx11::string::c_str();
        std::error_code::error_code<std::io_errc,void>(&local_330,stream);
        std::ios_base::failure[abi:cxx11]::failure(pcVar5,peVar6);
        __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      cell = Top_dimensional_cells_iterator::operator*
                       ((Top_dimensional_cells_iterator *)&filtrationLevel);
      pdVar7 = get_cell_data(this,cell);
      *pdVar7 = (double)sVar1;
      Top_dimensional_cells_iterator::operator++
                ((Top_dimensional_cells_iterator *)((long)&perseus_error_1.field_2 + 8),
                 (Top_dimensional_cells_iterator *)&filtrationLevel);
      Top_dimensional_cells_iterator::~Top_dimensional_cells_iterator
                ((Top_dimensional_cells_iterator *)((long)&perseus_error_1.field_2 + 8));
      line.field_2._8_8_ = line.field_2._8_8_ + 1;
    }
    std::__cxx11::string::~string((string *)local_2f8);
  }
  if (line.field_2._8_8_ != i) {
    std::__cxx11::to_string(&local_3f0,line.field_2._8_8_);
    std::operator+(&local_3d0,"Bad Perseus file format. Read ",&local_3f0);
    std::operator+(&local_3b0,&local_3d0," expected ");
    std::__cxx11::to_string(&local_410,i);
    std::operator+(&local_390,&local_3b0,&local_410);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370,
                   &local_390," values");
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3f0);
    psVar8 = (string *)__cxa_allocate_exception(0x20);
    std::ios_base::failure[abi:cxx11]::failure(psVar8);
    __cxa_throw(psVar8,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
  std::ifstream::close();
  impose_lower_star_filtration(this);
  Top_dimensional_cells_iterator::~Top_dimensional_cells_iterator
            ((Top_dimensional_cells_iterator *)&filtrationLevel);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dimensions);
  std::ifstream::~ifstream(&local_220);
  return;
}

Assistant:

void Bitmap_cubical_complex_base<T>::read_perseus_style_file(const char* perseus_style_file) {
  std::ifstream inFiltration(perseus_style_file);
  if(!inFiltration) throw std::ios_base::failure(std::string("Could not open the file ") + perseus_style_file);
  unsigned dimensionOfData;
  inFiltration >> dimensionOfData;

#ifdef DEBUG_TRACES
  std::clog << "dimensionOfData : " << dimensionOfData << std::endl;
#endif

  std::vector<unsigned> sizes;
  sizes.reserve(dimensionOfData);
  // all dimensions multiplied
  std::size_t dimensions = 1;
  for (std::size_t i = 0; i != dimensionOfData; ++i) {
    unsigned size_in_this_dimension;
    inFiltration >> size_in_this_dimension;
    sizes.push_back(size_in_this_dimension);
    dimensions *= size_in_this_dimension;
#ifdef DEBUG_TRACES
    std::clog << "size_in_this_dimension : " << size_in_this_dimension << std::endl;
#endif
  }
  this->set_up_containers(sizes, true);

  Bitmap_cubical_complex_base<T>::Top_dimensional_cells_iterator it = this->top_dimensional_cells_iterator_begin();

  T filtrationLevel = 0.;
  std::size_t filtration_counter = 0;
  while (!inFiltration.eof()) {
    std::string line;
    getline(inFiltration, line);
    if (line.length() != 0) {
      int n = sscanf(line.c_str(), "%lf", &filtrationLevel);
      if (n != 1) {
        std::string perseus_error("Bad Perseus file format. This line is incorrect : " + line);
        throw std::ios_base::failure(perseus_error.c_str());
      }

#ifdef DEBUG_TRACES
      std::clog << "Cell of an index : " << it.compute_index_in_bitmap()
                << " and dimension: " << this->get_dimension_of_a_cell(it.compute_index_in_bitmap())
                << " get the value : " << filtrationLevel << std::endl;
#endif
      this->get_cell_data(*it) = filtrationLevel;
      ++it;
      ++filtration_counter;
    }
  }

  if (filtration_counter != dimensions) {
    std::string perseus_error("Bad Perseus file format. Read " + std::to_string(filtration_counter) + " expected " + \
      std::to_string(dimensions) + " values");
    throw std::ios_base::failure(perseus_error);
  }

  inFiltration.close();
  this->impose_lower_star_filtration();
}